

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O0

void __thiscall
Test_TemplateModifiers_CleanseAttribute::Test_TemplateModifiers_CleanseAttribute
          (Test_TemplateModifiers_CleanseAttribute *this)

{
  value_type local_18;
  Test_TemplateModifiers_CleanseAttribute *local_10;
  Test_TemplateModifiers_CleanseAttribute *this_local;
  
  local_18 = Run;
  local_10 = this;
  std::vector<void_(*)(),_std::allocator<void_(*)()>_>::push_back(&g_testlist,&local_18);
  return;
}

Assistant:

TEST(TemplateModifiers, CleanseAttribute) {
  GOOGLE_NAMESPACE::TemplateDictionary dict("TestCleanseAttribute", NULL);
  dict.SetEscapedValue("easy attribute", "top",
                       GOOGLE_NAMESPACE::cleanse_attribute);
  dict.SetEscapedValue("harder attribute", "foo & bar",
                       GOOGLE_NAMESPACE::cleanse_attribute);
  dict.SetEscapedValue("hardest attribute",
                       "top onclick='alert(document.cookie)'",
                       GOOGLE_NAMESPACE::cleanse_attribute);
  dict.SetEscapedValue("equal in middle", "foo = bar",
                       GOOGLE_NAMESPACE::cleanse_attribute);
  dict.SetEscapedValue("leading equal", "=foo",
                       GOOGLE_NAMESPACE::cleanse_attribute);
  dict.SetEscapedValue("trailing equal", "foo=",
                       GOOGLE_NAMESPACE::cleanse_attribute);
  dict.SetEscapedValue("all equals", "===foo===bar===",
                       GOOGLE_NAMESPACE::cleanse_attribute);
  dict.SetEscapedValue("just equals", "===",
                       GOOGLE_NAMESPACE::cleanse_attribute);

  GOOGLE_NAMESPACE::TemplateDictionaryPeer peer(&dict);  // peer can look inside dicts
  EXPECT_STREQ(peer.GetSectionValue("easy attribute"), "top");
  EXPECT_STREQ(peer.GetSectionValue("harder attribute"), "foo___bar");
  EXPECT_STREQ(peer.GetSectionValue("hardest attribute"),
               "top_onclick=_alert_document.cookie__");

  EXPECT_STREQ(peer.GetSectionValue("equal in middle"), "foo_=_bar");
  EXPECT_STREQ(peer.GetSectionValue("leading equal"), "_foo");
  EXPECT_STREQ(peer.GetSectionValue("trailing equal"), "foo_");
  EXPECT_STREQ(peer.GetSectionValue("just equals"), "_=_");
  EXPECT_STREQ(peer.GetSectionValue("all equals"), "_==foo===bar==_");
}